

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

bool __thiscall google::protobuf::safe_strtob(protobuf *this,StringPiece str,bool *value)

{
  bool bVar1;
  LogMessage *pLVar2;
  undefined1 uVar3;
  StringPiece s1;
  StringPiece s1_00;
  StringPiece s1_01;
  StringPiece s1_02;
  StringPiece s1_03;
  StringPiece s1_04;
  StringPiece s1_05;
  StringPiece s1_06;
  StringPiece s1_07;
  StringPiece s1_08;
  LogFinisher local_101;
  StringPiece local_100;
  StringPiece local_f0;
  StringPiece local_e0;
  StringPiece local_d0;
  StringPiece local_c0;
  StringPiece local_b0;
  StringPiece local_a0;
  StringPiece local_90;
  StringPiece local_80;
  StringPiece local_70;
  LogMessage local_60;
  
  s1.length_ = str.ptr_;
  if ((undefined1 *)str.length_ == (undefined1 *)0x0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,"third_party/protobuf-lite/strutil.cc",0x519);
    pLVar2 = internal::LogMessage::operator<<(&local_60,"CHECK failed: value != nullptr: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"nullptr output boolean given.");
    internal::LogFinisher::operator=(&local_101,pLVar2);
    internal::LogMessage::~LogMessage(&local_60);
  }
  StringPiece::StringPiece(&local_70,"true");
  s1.ptr_ = (char *)this;
  bVar1 = CaseEqual(s1,local_70);
  uVar3 = 1;
  if (!bVar1) {
    StringPiece::StringPiece(&local_80,"t");
    s1_00.length_ = (stringpiece_ssize_type)s1.length_;
    s1_00.ptr_ = (char *)this;
    bVar1 = CaseEqual(s1_00,local_80);
    if (!bVar1) {
      StringPiece::StringPiece(&local_90,"yes");
      s1_01.length_ = (stringpiece_ssize_type)s1.length_;
      s1_01.ptr_ = (char *)this;
      bVar1 = CaseEqual(s1_01,local_90);
      if (!bVar1) {
        StringPiece::StringPiece(&local_a0,"y");
        s1_02.length_ = (stringpiece_ssize_type)s1.length_;
        s1_02.ptr_ = (char *)this;
        bVar1 = CaseEqual(s1_02,local_a0);
        if (!bVar1) {
          StringPiece::StringPiece(&local_b0,"1");
          s1_03.length_ = (stringpiece_ssize_type)s1.length_;
          s1_03.ptr_ = (char *)this;
          bVar1 = CaseEqual(s1_03,local_b0);
          if (!bVar1) {
            StringPiece::StringPiece(&local_c0,"false");
            s1_04.length_ = (stringpiece_ssize_type)s1.length_;
            s1_04.ptr_ = (char *)this;
            bVar1 = CaseEqual(s1_04,local_c0);
            if (!bVar1) {
              StringPiece::StringPiece(&local_d0,"f");
              s1_05.length_ = (stringpiece_ssize_type)s1.length_;
              s1_05.ptr_ = (char *)this;
              bVar1 = CaseEqual(s1_05,local_d0);
              if (!bVar1) {
                StringPiece::StringPiece(&local_e0,"no");
                s1_06.length_ = (stringpiece_ssize_type)s1.length_;
                s1_06.ptr_ = (char *)this;
                bVar1 = CaseEqual(s1_06,local_e0);
                if (!bVar1) {
                  StringPiece::StringPiece(&local_f0,"n");
                  s1_07.length_ = (stringpiece_ssize_type)s1.length_;
                  s1_07.ptr_ = (char *)this;
                  bVar1 = CaseEqual(s1_07,local_f0);
                  if (!bVar1) {
                    StringPiece::StringPiece(&local_100,"0");
                    s1_08.length_ = (stringpiece_ssize_type)s1.length_;
                    s1_08.ptr_ = (char *)this;
                    bVar1 = CaseEqual(s1_08,local_100);
                    uVar3 = 0;
                    if (!bVar1) {
                      return false;
                    }
                    goto LAB_001b22e7;
                  }
                }
              }
            }
            uVar3 = 0;
          }
        }
      }
    }
  }
LAB_001b22e7:
  *(undefined1 *)str.length_ = uVar3;
  return true;
}

Assistant:

bool safe_strtob(StringPiece str, bool* value) {
  GOOGLE_CHECK(value != nullptr) << "nullptr output boolean given.";
  if (CaseEqual(str, "true") || CaseEqual(str, "t") ||
      CaseEqual(str, "yes") || CaseEqual(str, "y") ||
      CaseEqual(str, "1")) {
    *value = true;
    return true;
  }
  if (CaseEqual(str, "false") || CaseEqual(str, "f") ||
      CaseEqual(str, "no") || CaseEqual(str, "n") ||
      CaseEqual(str, "0")) {
    *value = false;
    return true;
  }
  return false;
}